

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeTry(Ref try_,Ref arg,Ref catch_)

{
  char cVar1;
  Ref *pRVar2;
  Ref RVar3;
  Ref r;
  Value *pVVar4;
  Ref local_28;
  Ref try__local;
  Ref catch__local;
  
  local_28.inst = try_.inst;
  try__local = catch_;
  pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&local_28);
  cVar1 = cashew::Ref::operator==(pRVar2,(IString *)&BLOCK);
  if (cVar1 == '\0') {
    __assert_fail("try_[0] == BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6fd,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
  }
  pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&try__local);
  cVar1 = cashew::Ref::operator==(pRVar2,(IString *)&BLOCK);
  if (cVar1 != '\0') {
    RVar3 = makeRawArray(3);
    r = makeRawString((IString *)&TRY);
    pVVar4 = Value::push_back(RVar3.inst,r);
    pVVar4 = Value::push_back(pVVar4,local_28);
    pVVar4 = Value::push_back(pVVar4,arg);
    RVar3.inst = Value::push_back(pVVar4,try__local);
    return (Ref)RVar3.inst;
  }
  __assert_fail("catch_[0] == BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6fe,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
}

Assistant:

static Ref makeTry(Ref try_, Ref arg, Ref catch_) {
    assert(try_[0] == BLOCK);
    assert(catch_[0] == BLOCK);
    return &makeRawArray(3)
              ->push_back(makeRawString(TRY))
              .push_back(try_)
              .push_back(arg)
              .push_back(catch_);
  }